

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O1

int beagleSetEigenDecomposition
              (int instance,int eigenIndex,double *inEigenVectors,double *inInverseEigenVectors,
              double *inEigenValues)

{
  pointer ppBVar1;
  int iVar2;
  BeagleImpl *pBVar3;
  
  ppBVar1 = (instances->
            super__Vector_base<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_>)._M_impl
            .super__Vector_impl_data._M_start;
  if ((ulong)((long)(instances->
                    super__Vector_base<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_>)
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1 >> 3) <
      (ulong)(long)instance) {
    pBVar3 = (BeagleImpl *)0x0;
  }
  else {
    pBVar3 = ppBVar1[instance];
  }
  if (pBVar3 == (BeagleImpl *)0x0) {
    iVar2 = -4;
  }
  else {
    iVar2 = (**(code **)(*(long *)pBVar3 + 0x50))();
  }
  return iVar2;
}

Assistant:

BeagleImpl* getBeagleInstance(int instanceIndex) {
    if (instanceIndex > instances->size())
        return NULL;
    return (*instances)[instanceIndex];
}